

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinitionRewriting.cpp
# Opt level: O1

Clause * performRewriting(Clause *rwClause,Literal *rwLit,TermList rwTerm,Clause *eqClause,
                         Literal *eqLit,TermList eqLHS,ResultSubstitutionSP *subst,
                         DemodulationHelper *helper,bool *isEqTautology,Inference *inf)

{
  Literal ***pppLVar1;
  uint uVar2;
  Self SVar3;
  bool bVar4;
  int iVar5;
  TermList TVar6;
  undefined4 extraout_var;
  Literal *pLVar7;
  ulong uVar8;
  ulong uVar9;
  undefined4 extraout_var_00;
  Clause *pCVar10;
  uint uVar11;
  Literal **ppLVar12;
  Literal **ppLVar13;
  Literal **ppLVar14;
  RStack<Literal_*> resLits;
  Applicator appl;
  Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_98;
  TermList local_88;
  Literal *local_80;
  SubstApplicator local_78;
  ResultSubstitution *local_70;
  Inference local_68;
  
  local_80 = eqLit;
  TVar6 = Kernel::EqHelper::getOtherEqualitySide(eqLit,eqLHS);
  TVar6._content._0_4_ = (*subst->_obj->_vptr_ResultSubstitution[0xf])(subst->_obj,TVar6._content);
  TVar6._content._4_4_ = extraout_var;
  local_70 = subst->_obj;
  local_78._vptr_SubstApplicator = (_func_int **)&PTR__SubstApplicator_00b64b78;
  if ((helper == (DemodulationHelper *)0x0) ||
     (bVar4 = Inferences::DemodulationHelper::isPremiseRedundant
                        (helper,rwClause,rwLit,rwTerm,TVar6,eqLHS,&local_78), bVar4)) {
    pLVar7 = Kernel::EqHelper::replace(rwLit,rwTerm,TVar6);
    if (((pLVar7->super_Term)._functor != 0) ||
       ((((pLVar7->super_Term)._args[0]._content & 4) == 0 ||
        (uVar8 = (ulong)(*(uint *)&(pLVar7->super_Term).field_0xc & 0xfffffff),
        (pLVar7->super_Term)._args[uVar8]._content != (pLVar7->super_Term)._args[uVar8 - 1]._content
        )))) {
      local_88._content = rwTerm._content;
      Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      Recycled(&local_98);
      SVar3._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
           (__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
            )(__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
              )local_98._self;
      if (*(Literal ***)
           ((long)local_98._self._M_t.
                  super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                  .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x10
           ) == *(Literal ***)
                 ((long)local_98._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl
                 + 0x18)) {
        Lib::Stack<Kernel::Literal_*>::expand
                  ((Stack<Kernel::Literal_*> *)
                   local_98._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl);
      }
      **(Literal ***)
        ((long)SVar3._M_t.
               super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
               .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl + 0x10) =
           pLVar7;
      pppLVar1 = (Literal ***)
                 ((long)SVar3._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl
                 + 0x10);
      *pppLVar1 = *pppLVar1 + 1;
      uVar11 = *(uint *)&rwClause->field_0x38 & 0xfffff;
      if (uVar11 != 0) {
        uVar8 = (ulong)(uVar11 != 0);
        ppLVar12 = rwClause->_literals;
        ppLVar13 = rwClause->_literals + uVar8;
        do {
          if (*ppLVar12 == rwLit) {
            iVar5 = 3;
          }
          else {
            pLVar7 = Kernel::EqHelper::replace(*ppLVar12,local_88,TVar6);
            SVar3._M_t.
            super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
            .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
                 (__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                  )(__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                    )local_98._self;
            if ((((pLVar7->super_Term)._functor == 0) &&
                (((pLVar7->super_Term)._args[0]._content & 4) != 0)) &&
               (uVar9 = (ulong)(*(uint *)&(pLVar7->super_Term).field_0xc & 0xfffffff),
               (pLVar7->super_Term)._args[uVar9]._content ==
               (pLVar7->super_Term)._args[uVar9 - 1]._content)) {
              *isEqTautology = true;
              iVar5 = 1;
            }
            else {
              if (*(Literal ***)
                   ((long)local_98._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                          _M_head_impl + 0x10) ==
                  *(Literal ***)
                   ((long)local_98._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                          _M_head_impl + 0x18)) {
                Lib::Stack<Kernel::Literal_*>::expand
                          ((Stack<Kernel::Literal_*> *)
                           local_98._self._M_t.
                           super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                           .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                           _M_head_impl);
              }
              **(Literal ***)
                ((long)SVar3._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                       .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl +
                0x10) = pLVar7;
              pppLVar1 = (Literal ***)
                         ((long)SVar3._M_t.
                                super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                _M_head_impl + 0x10);
              *pppLVar1 = *pppLVar1 + 1;
              iVar5 = 0;
            }
          }
          if ((iVar5 != 3) && (iVar5 != 0)) goto LAB_004ddb38;
          uVar2 = (uint)uVar8;
          ppLVar14 = ppLVar13 + 1;
          if (uVar11 <= uVar2) {
            ppLVar13 = (Literal **)0x0;
          }
          uVar8 = (ulong)(uVar2 + 1);
          ppLVar12 = ppLVar13;
          ppLVar13 = ppLVar14;
        } while (uVar2 < uVar11);
      }
      uVar11 = *(uint *)&eqClause->field_0x38 & 0xfffff;
      if (uVar11 != 0) {
        uVar8 = (ulong)(uVar11 != 0);
        ppLVar13 = eqClause->_literals;
        ppLVar12 = eqClause->_literals + uVar8;
        do {
          if (*ppLVar13 == local_80) {
            iVar5 = 5;
          }
          else {
            iVar5 = (*subst->_obj->_vptr_ResultSubstitution[0x10])();
            SVar3._M_t.
            super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
            .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl =
                 (__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                  )(__uniq_ptr_data<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>,_true,_true>
                    )local_98._self;
            pLVar7 = (Literal *)CONCAT44(extraout_var_00,iVar5);
            if ((((pLVar7->super_Term)._functor == 0) &&
                (((pLVar7->super_Term)._args[0]._content & 4) != 0)) &&
               (uVar9 = (ulong)(*(uint *)&(pLVar7->super_Term).field_0xc & 0xfffffff),
               (pLVar7->super_Term)._args[uVar9]._content ==
               (pLVar7->super_Term)._args[uVar9 - 1]._content)) {
              *isEqTautology = true;
              iVar5 = 1;
            }
            else {
              if (*(Literal ***)
                   ((long)local_98._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                          _M_head_impl + 0x10) ==
                  *(Literal ***)
                   ((long)local_98._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                          .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                          _M_head_impl + 0x18)) {
                Lib::Stack<Kernel::Literal_*>::expand
                          ((Stack<Kernel::Literal_*> *)
                           local_98._self._M_t.
                           super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                           .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                           _M_head_impl);
              }
              **(Literal ***)
                ((long)SVar3._M_t.
                       super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                       .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>._M_head_impl +
                0x10) = pLVar7;
              pppLVar1 = (Literal ***)
                         ((long)SVar3._M_t.
                                super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                                .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                                _M_head_impl + 0x10);
              *pppLVar1 = *pppLVar1 + 1;
              iVar5 = 0;
            }
          }
          if ((iVar5 != 5) && (iVar5 != 0)) goto LAB_004ddb38;
          uVar2 = (uint)uVar8;
          ppLVar13 = ppLVar12;
          if (uVar11 <= uVar2) {
            ppLVar13 = (Literal **)0x0;
          }
          uVar8 = (ulong)(uVar2 + 1);
          ppLVar12 = ppLVar12 + 1;
        } while (uVar2 < uVar11);
      }
      local_68._0_8_ = *(undefined8 *)inf;
      local_68._8_4_ = *(undefined4 *)&inf->field_0x8;
      local_68._age = inf->_age;
      local_68._splits = inf->_splits;
      local_68._ptr1 = inf->_ptr1;
      local_68._ptr2 = inf->_ptr2;
      local_68.th_ancestors = inf->th_ancestors;
      local_68.all_ancestors = inf->all_ancestors;
      pCVar10 = Kernel::Clause::fromStack
                          ((Stack<Kernel::Literal_*> *)
                           local_98._self._M_t.
                           super___uniq_ptr_impl<Lib::Stack<Kernel::Literal_*>,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_Lib::Stack<Kernel::Literal_*>_*,_std::default_delete<Lib::Stack<Kernel::Literal_*>_>_>
                           .super__Head_base<0UL,_Lib::Stack<Kernel::Literal_*>_*,_false>.
                           _M_head_impl,&local_68);
      goto LAB_004ddb3a;
    }
    *isEqTautology = true;
  }
  return (Clause *)0x0;
LAB_004ddb38:
  pCVar10 = (Clause *)0x0;
LAB_004ddb3a:
  Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(&local_98);
  return pCVar10;
}

Assistant:

Clause* performRewriting(
    Clause *rwClause, Literal *rwLit, TermList rwTerm, Clause *eqClause,
    Literal *eqLit, TermList eqLHS, ResultSubstitutionSP subst,
    DemodulationHelper* helper, bool& isEqTautology, Inference&& inf)
{
  ASS(!eqLHS.isVar());

  TermList tgtTerm = EqHelper::getOtherEqualitySide(eqLit, eqLHS);

  // This should be the case for code trees
  ASS(subst->isIdentityOnQueryWhenResultBound());
  TermList tgtTermS = subst->applyToBoundResult(tgtTerm);

  Applicator appl(subst.ptr());

  if (helper && !helper->isPremiseRedundant(rwClause,rwLit,rwTerm,tgtTermS,eqLHS,&appl)) {
    return 0;
  }

  Literal *tgtLitS = EqHelper::replace(rwLit, rwTerm, tgtTermS);
  if (EqHelper::isEqTautology(tgtLitS)) {
    isEqTautology = true;
    return 0;
  }

  RStack<Literal*> resLits;

  resLits->push(tgtLitS);

  for (Literal *curr : rwClause->iterLits()) {
    if (curr == rwLit) {
      continue;
    }
    curr = EqHelper::replace(curr, rwTerm, tgtTermS);

    if (EqHelper::isEqTautology(curr)) {
      isEqTautology = true;
      return nullptr;
    }

    resLits->push(curr);
  }

  for (Literal* curr : eqClause->iterLits()) {
    if (curr == eqLit) {
      continue;
    }
    Literal* currAfter = subst->applyToBoundResult(curr);

    if (EqHelper::isEqTautology(currAfter)) {
      isEqTautology = true;
      return nullptr;
    }

    resLits->push(currAfter);
  }

  return Clause::fromStack(*resLits, inf);
}